

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack11_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x7ff;
  out[1] = uVar1 >> 0xb & 0x7ff;
  uVar2 = in[1];
  out[2] = uVar1 >> 0x16;
  out[2] = uVar1 >> 0x16 | (uVar2 & 1) << 10;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_0019ff70);
  auVar4._8_4_ = 0x7ff;
  auVar4._0_8_ = 0x7ff000007ff;
  auVar4._12_4_ = 0x7ff;
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 3) = auVar3._0_8_;
  out[5] = uVar2 >> 0x17;
  out[5] = uVar2 >> 0x17 | (in[2] & 3) << 9;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_0019ff80);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 6) = auVar3._0_8_;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack11_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 11);
  out++;
  *out = ((*in) >> 11) % (1U << 11);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 1)) << (11 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 11);
  out++;
  *out = ((*in) >> 12) % (1U << 11);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 2)) << (11 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 11);
  out++;
  *out = ((*in) >> 13) % (1U << 11);
  out++;

  return in + 1;
}